

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_pool16c_nanomips_insn(DisasContext_conflict6 *ctx)

{
  int rd;
  uint uVar1;
  uint32_t opc;
  
  rd = *(int *)(decode_gpr_gpr3_map + (ctx->opcode >> 5 & 0x1c));
  uVar1 = ctx->opcode >> 2;
  switch(uVar1 & 3) {
  case 0:
    gen_logic(ctx,0x27,rd,*(int *)(decode_gpr_gpr3_map + (uVar1 & 0x1c)),0);
    return;
  case 1:
    opc = 0x26;
    break;
  case 2:
    opc = 0x24;
    break;
  case 3:
    opc = 0x25;
  }
  gen_logic(ctx,opc,rd,rd,*(int *)(decode_gpr_gpr3_map + (uVar1 & 0x1c)));
  return;
}

Assistant:

static void gen_pool16c_nanomips_insn(DisasContext *ctx)
{
    int rt = decode_gpr_gpr3(NANOMIPS_EXTRACT_RT3(ctx->opcode));
    int rs = decode_gpr_gpr3(NANOMIPS_EXTRACT_RS3(ctx->opcode));

    switch (extract32(ctx->opcode, 2, 2)) {
    case NM_NOT16:
        gen_logic(ctx, OPC_NOR, rt, rs, 0);
        break;
    case NM_AND16:
        gen_logic(ctx, OPC_AND, rt, rt, rs);
        break;
    case NM_XOR16:
        gen_logic(ctx, OPC_XOR, rt, rt, rs);
        break;
    case NM_OR16:
        gen_logic(ctx, OPC_OR, rt, rt, rs);
        break;
    }
}